

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::AsyncIoStreamWithInitialBuffer::tryRead
          (AsyncIoStreamWithInitialBuffer *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  long *plVar1;
  long lVar2;
  undefined8 uVar3;
  OwnPromiseNode node;
  unsigned_long *in_R8;
  unsigned_long *__n;
  Fault f;
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  AsyncInputStream local_78;
  unsigned_long *local_70;
  size_t local_68;
  OwnPromiseNode local_60;
  DebugComparison<unsigned_long_&,_unsigned_long_&> local_58;
  anon_class_8_1_0bacd73b_for_func local_30;
  
  local_58.right = &local_68;
  local_58.left = (unsigned_long *)&local_70;
  local_58.op.content.ptr = " >= ";
  local_58.op.content.size_ = 5;
  local_58.result = maxBytes <= in_R8;
  local_68 = maxBytes;
  if (local_58.result) {
    __n = *(unsigned_long **)((long)buffer + 0x40);
    if (__n < maxBytes) {
      local_70 = in_R8;
      if (__n != (unsigned_long *)0x0) {
        memcpy((void *)minBytes,*(void **)((long)buffer + 0x38),(size_t)__n);
        *(undefined8 *)((long)buffer + 0x38) = 0;
        *(undefined8 *)((long)buffer + 0x40) = 0;
        lVar2 = *(long *)((long)buffer + 0x20);
        if (lVar2 != 0) {
          uVar3 = *(undefined8 *)((long)buffer + 0x28);
          *(undefined8 *)((long)buffer + 0x20) = 0;
          *(undefined8 *)((long)buffer + 0x28) = 0;
          (**(code **)**(undefined8 **)((long)buffer + 0x30))
                    (*(undefined8 **)((long)buffer + 0x30),lVar2,1,uVar3,uVar3,0);
        }
        local_68 = local_68 - (long)__n;
        local_70 = (unsigned_long *)((long)local_70 - (long)__n);
      }
      (**(code **)(**(long **)((long)buffer + 0x18) + 8))
                (&local_60,*(long **)((long)buffer + 0x18),minBytes + (long)__n,local_68,local_70);
      local_58.left =
           (unsigned_long *)
           kj::_::
           SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:4593:17)>
           ::anon_class_8_1_0bacd73b_for_func::operator();
      local_30.bytesToCopy = (size_t)__n;
      kj::_::PromiseDisposer::
      appendPromise<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::AsyncIoStreamWithInitialBuffer::tryRead(void*,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_>,kj::_::PromiseDisposer,kj::AsyncIoStreamWithInitialBuffer::tryRead(void*,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_,void*&>
                ((PromiseDisposer *)&local_78,&local_60,&local_30,&local_58.left);
      node.ptr = local_60.ptr;
      (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
           local_78._vptr_AsyncInputStream;
      if (&(local_60.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
        local_60.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
      }
    }
    else {
      if (in_R8 < __n) {
        __n = in_R8;
      }
      memcpy((void *)minBytes,*(void **)((long)buffer + 0x38),(size_t)__n);
      *(long *)((long)buffer + 0x38) = *(long *)((long)buffer + 0x38) + (long)__n;
      plVar1 = (long *)((long)buffer + 0x40);
      *plVar1 = *plVar1 - (long)__n;
      if ((*plVar1 == 0) && (lVar2 = *(long *)((long)buffer + 0x20), lVar2 != 0)) {
        uVar3 = *(undefined8 *)((long)buffer + 0x28);
        *(undefined8 *)((long)buffer + 0x20) = 0;
        *(undefined8 *)((long)buffer + 0x28) = 0;
        (**(code **)**(undefined8 **)((long)buffer + 0x30))
                  (*(undefined8 **)((long)buffer + 0x30),lVar2,1,uVar3,uVar3,0);
      }
      local_58.left = __n;
      kj::_::PromiseDisposer::
      alloc<kj::_::ImmediatePromiseNode<unsigned_long>,kj::_::PromiseDisposer,unsigned_long>
                ((PromiseDisposer *)&local_78,(unsigned_long *)&local_58);
      (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
           local_78._vptr_AsyncInputStream;
    }
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&>
            ((Fault *)&local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x11cf,FAILED,"maxBytes >= minBytes","_kjCondition,",&local_58);
  kj::_::Debug::Fault::fatal((Fault *)&local_78);
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    KJ_REQUIRE(maxBytes >= minBytes);
    auto destination = static_cast<byte*>(buffer);

    // If there are at least minBytes available in the leftover buffer...
    if (leftover.size() >= minBytes) {
      // We are going to immediately read up to maxBytes from the leftover buffer...
      auto bytesToCopy = kj::min(maxBytes, leftover.size());
      memcpy(destination, leftover.begin(), bytesToCopy);
      leftover = leftover.slice(bytesToCopy, leftover.size());

      // If we've consumed all of the data in the leftover buffer, go ahead and free it.
      if (leftover.size() == 0) {
        leftoverBackingBuffer = nullptr;
      }

      return bytesToCopy;
    } else {
      // We know here that leftover.size() is less than minBytes, but it might not
      // be zero. Copy everything from leftover into the destination buffer then read
      // the rest from the underlying stream.
      auto bytesToCopy = leftover.size();
      KJ_DASSERT(bytesToCopy < minBytes);

      if (bytesToCopy > 0) {
        memcpy(destination, leftover.begin(), bytesToCopy);
        leftover = nullptr;
        leftoverBackingBuffer = nullptr;
        minBytes -= bytesToCopy;
        maxBytes -= bytesToCopy;
        KJ_DASSERT(minBytes >= 1);
        KJ_DASSERT(maxBytes >= minBytes);
      }

      return stream->tryRead(destination + bytesToCopy, minBytes, maxBytes)
          .then([bytesToCopy](size_t amount) { return amount + bytesToCopy; });
    }
  }